

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O2

void DoSectorDamage(AActor *actor,sector_t *sec,int amount,FName *type,PClassActor *protectClass,
                   int flags)

{
  AInventory *pAVar1;
  DAngle in_XMM0_Qa;
  double dVar2;
  double extraout_XMM0_Qa;
  FName local_34;
  undefined8 local_30;
  
  if (((((actor->flags).Value & 4) != 0) &&
      (((flags & 2U) != 0 || (actor->player != (player_t *)0x0)))) &&
     (((flags & 1U) != 0 || (actor->player == (player_t *)0x0)))) {
    if ((flags & 4U) == 0) {
      dVar2 = secplane_t::ZatPoint(&sec->floorplane,actor);
      in_XMM0_Qa.Degrees = 1.52587890625e-05;
      if ((1.52587890625e-05 <= ABS((actor->__Pos).Z - dVar2)) && (actor->waterlevel == 0)) {
        return;
      }
    }
    if ((protectClass == (PClassActor *)0x0) ||
       (pAVar1 = AActor::FindInventory(actor,protectClass,SUB41((flags & 8U) >> 3,0)),
       in_XMM0_Qa.Degrees = extraout_XMM0_Qa, pAVar1 == (AInventory *)0x0)) {
      local_34 = (FName)type->Index;
      local_30 = 0;
      P_DamageMobj(actor,(AActor *)0x0,(AActor *)0x0,amount,&local_34,0,in_XMM0_Qa);
    }
  }
  return;
}

Assistant:

static void DoSectorDamage(AActor *actor, sector_t *sec, int amount, FName type, PClassActor *protectClass, int flags)
{
	if (!(actor->flags & MF_SHOOTABLE))
		return;

	if (!(flags & DAMAGE_NONPLAYERS) && actor->player == NULL)
		return;

	if (!(flags & DAMAGE_PLAYERS) && actor->player != NULL)
		return;

	if (!(flags & DAMAGE_IN_AIR) && !actor->isAtZ(sec->floorplane.ZatPoint(actor)) && !actor->waterlevel)
		return;

	if (protectClass != NULL)
	{
		if (actor->FindInventory(protectClass, !!(flags & DAMAGE_SUBCLASSES_PROTECT)))
			return;
	}

	P_DamageMobj (actor, NULL, NULL, amount, type);
}